

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_Defaults_Test::TestBody
          (ExtensionSetTest_Defaults_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_110;
  Message local_108;
  ConstType local_100;
  ImportMessage *local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  ConstType local_d0;
  ForeignMessage *local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  ConstType local_a0;
  TestAllTypes_NestedMessage *local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  ConstType local_70;
  OptionalGroup_extension *local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  TestAllExtensions message;
  ExtensionSetTest_Defaults_Test *this_local;
  
  message.field_0._24_8_ = this;
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_40);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_40)
  ;
  local_68 = proto2_unittest::OptionalGroup_extension::default_instance();
  local_70 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false,_0>
                       ((TestAllExtensions *)local_40,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionalGroup_extension>,_(unsigned_char)__n_,_false>
                         *)proto2_unittest::optionalgroup_extension);
  testing::internal::EqHelper::
  Compare<const_proto2_unittest::OptionalGroup_extension_*,_const_proto2_unittest::OptionalGroup_extension_*,_nullptr>
            ((EqHelper *)local_60,"&unittest::OptionalGroup_extension::default_instance()",
             "&message.GetExtension(unittest::optionalgroup_extension)",&local_68,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = proto2_unittest::TestAllTypes_NestedMessage::default_instance();
  local_a0 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false,_0>
                       ((TestAllExtensions *)local_40,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::optional_nested_message_extension);
  testing::internal::EqHelper::
  Compare<const_proto2_unittest::TestAllTypes_NestedMessage_*,_const_proto2_unittest::TestAllTypes_NestedMessage_*,_nullptr>
            ((EqHelper *)local_90,"&unittest::TestAllTypes::NestedMessage::default_instance()",
             "&message.GetExtension(unittest::optional_nested_message_extension)",&local_98,
             &local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = proto2_unittest::ForeignMessage::default_instance();
  local_d0 = proto2_unittest::TestAllExtensions::
             GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false,_0>
                       ((TestAllExtensions *)local_40,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::optional_foreign_message_extension);
  testing::internal::EqHelper::
  Compare<const_proto2_unittest::ForeignMessage_*,_const_proto2_unittest::ForeignMessage_*,_nullptr>
            ((EqHelper *)local_c0,"&unittest::ForeignMessage::default_instance()",
             "&message.GetExtension(unittest::optional_foreign_message_extension)",&local_c8,
             &local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = proto2_unittest_import::ImportMessage::default_instance();
  local_100 = proto2_unittest::TestAllExtensions::
              GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false,_0>
                        ((TestAllExtensions *)local_40,
                         (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false>
                          *)proto2_unittest::optional_import_message_extension);
  testing::internal::EqHelper::
  Compare<const_proto2_unittest_import::ImportMessage_*,_const_proto2_unittest_import::ImportMessage_*,_nullptr>
            ((EqHelper *)local_f0,"&unittest_import::ImportMessage::default_instance()",
             "&message.GetExtension(unittest::optional_import_message_extension)",&local_f8,
             &local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_40);
  return;
}

Assistant:

TEST(ExtensionSetTest, Defaults) {
  // Check that all default values are set correctly in the initial message.
  unittest::TestAllExtensions message;

  TestUtil::ExpectExtensionsClear(message);

  // Messages should return pointers to default instances until first use.
  // (This is not checked by ExpectClear() since it is not actually true after
  // the fields have been set and then cleared.)
  EXPECT_EQ(&unittest::OptionalGroup_extension::default_instance(),
            &message.GetExtension(unittest::optionalgroup_extension));
  EXPECT_EQ(&unittest::TestAllTypes::NestedMessage::default_instance(),
            &message.GetExtension(unittest::optional_nested_message_extension));
  EXPECT_EQ(
      &unittest::ForeignMessage::default_instance(),
      &message.GetExtension(unittest::optional_foreign_message_extension));
  EXPECT_EQ(&unittest_import::ImportMessage::default_instance(),
            &message.GetExtension(unittest::optional_import_message_extension));
}